

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O0

string * __thiscall
database::ComparableString::_ToLowerCase
          (string *__return_storage_ptr__,ComparableString *this,string *string)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  string *string_local;
  ComparableString *this_local;
  string *_string;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (__first,__last,__result,tolower);
  return __return_storage_ptr__;
}

Assistant:

std::string _ToLowerCase(const std::string& string) const
    {
      std::string _string = string;
      std::transform(_string.begin(),_string.end(),_string.begin(),::tolower);
      return _string;
    }